

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

int qc_list_inserttail2(QcList *list,void *data,QcListEntry **pp_entry)

{
  uint *puVar1;
  QcListEntry *pQVar2;
  QcListEntry *pQVar3;
  int iVar4;
  QcList *pQVar5;
  
  if (list == (QcList *)0x0) {
    qc_list_inserttail2_cold_3();
    pQVar5 = list;
  }
  else {
    pQVar5 = list;
    if (data != (void *)0x0) {
      pQVar5 = (QcList *)0x1;
      pQVar2 = (QcListEntry *)calloc(1,0x18);
      if (pQVar2 != (QcListEntry *)0x0) {
        pQVar2->data = data;
        pQVar5 = (QcList *)list->tail;
        pQVar2->prev = (QcListEntry *)pQVar5;
        if (pQVar5 == (QcList *)0x0) {
          pQVar5 = list;
        }
        pQVar5->head = pQVar2;
        list->tail = pQVar2;
        list->count = list->count + 1;
        *pp_entry = pQVar2;
        return 0;
      }
      goto LAB_00104007;
    }
  }
  qc_list_inserttail2_cold_2();
LAB_00104007:
  qc_list_inserttail2_cold_1();
  if (pQVar5 != (QcList *)0x0) {
    pQVar2 = pQVar5->head;
    if (pQVar2 == (QcListEntry *)0x0) {
      iVar4 = 0;
    }
    else {
      pQVar3 = pQVar2->next;
      if (pQVar5->cur == pQVar2) {
        pQVar5->cur = pQVar3;
      }
      pQVar5->head = pQVar3;
      if (pQVar3 != (QcListEntry *)0x0) {
        pQVar3->prev = (QcListEntry *)0x0;
      }
      puVar1 = &pQVar5->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        pQVar5->tail = (QcListEntry *)0x0;
      }
      iVar4 = (int)pQVar2->data;
      free(pQVar2);
    }
    return iVar4;
  }
  qc_list_pophead_cold_1();
  if (pQVar5 != (QcList *)0x0) {
    if (pQVar5->head == (QcListEntry *)0x0) {
      iVar4 = 0;
    }
    else {
      pQVar2 = pQVar5->tail;
      if (pQVar5->cur == pQVar2) {
        pQVar5->cur = (QcListEntry *)0x0;
      }
      if (pQVar2 == pQVar5->head) {
        pQVar5->head = (QcListEntry *)0x0;
        pQVar3 = pQVar2->prev;
      }
      else {
        pQVar3 = pQVar2->prev;
        pQVar3->next = (QcListEntry *)0x0;
      }
      pQVar5->tail = pQVar3;
      pQVar5->count = pQVar5->count - 1;
      iVar4 = (int)pQVar2->data;
      free(pQVar2);
    }
    return iVar4;
  }
  qc_list_poptail_cold_1();
  pQVar5->cur = pQVar5->head;
  return (int)pQVar5->head;
}

Assistant:

int qc_list_inserttail2(QcList *list, void *data, QcListEntry **pp_entry)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        *pp_entry = NULL;
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    *pp_entry  = entry;
    
    return 0;
}